

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_operators.hpp
# Opt level: O0

uhugeint_t duckdb::Cast::Operation<duckdb::interval_t,_duckdb::uhugeint_t>(interval_t input)

{
  interval_t input_00;
  bool bVar1;
  InvalidInputException *this;
  undefined8 in_RSI;
  uhugeint_t *in_RDI;
  uhugeint_t result;
  undefined1 in_stack_00000180 [16];
  string *in_stack_ffffffffffffff78;
  bool in_stack_ffffffffffffffcf;
  uhugeint_t local_10;
  
  input_00.micros = (int64_t)in_RDI;
  input_00._0_8_ = in_RSI;
  bVar1 = TryCast::Operation<duckdb::interval_t,_duckdb::uhugeint_t>
                    (input_00,in_RDI,in_stack_ffffffffffffffcf);
  if (!bVar1) {
    this = (InvalidInputException *)__cxa_allocate_exception(0x10);
    CastExceptionText<duckdb::interval_t,_duckdb::uhugeint_t>((interval_t)in_stack_00000180);
    InvalidInputException::InvalidInputException(this,in_stack_ffffffffffffff78);
    __cxa_throw(this,&InvalidInputException::typeinfo,InvalidInputException::~InvalidInputException)
    ;
  }
  return local_10;
}

Assistant:

static inline DST Operation(SRC input) {
		DST result;
		if (!TryCast::Operation(input, result)) {
			throw InvalidInputException(CastExceptionText<SRC, DST>(input));
		}
		return result;
	}